

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O3

void __thiscall
ot::commissioner::JoinerSession::SendJoinFinResponse
          (JoinerSession *this,Request *aJoinFinReq,bool aAccept)

{
  char cVar1;
  undefined4 uVar2;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  Error error;
  Response joinFin;
  string local_178;
  undefined1 local_158 [8];
  _Alloc_hider _Stack_150;
  undefined1 local_148 [24];
  code *local_130;
  code *local_128;
  JoinerSession *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  _func_int **local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [104];
  event *local_50 [4];
  
  local_d8._M_p = (pointer)&local_c8;
  local_e0._0_4_ = kNone;
  local_d0 = (_func_int **)0x0;
  local_c8._M_local_buf[0] = '\0';
  local_120 = this;
  coap::Message::Message((Message *)local_b8,kAcknowledgment,kChanged);
  tlv::Tlv::Tlv((Tlv *)&local_178,kNetworkDiagChildTable,aAccept - 1U | 1,kMeshCoP);
  AppendTlv((Error *)local_158,(Message *)local_b8,(Tlv *)&local_178);
  local_e0._0_4_ = local_158._0_4_;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&_Stack_150);
  uVar2 = local_e0._0_4_;
  if (_Stack_150._M_p != local_148 + 8) {
    operator_delete(_Stack_150._M_p);
  }
  if ((void *)local_178._M_string_length != (void *)0x0) {
    operator_delete((void *)local_178._M_string_length);
  }
  if (uVar2 == kNone) {
    local_50[2]._0_1_ = kJoinFinResponse;
    coap::Coap::SendResponse((Error *)local_158,&local_120->mCoap,aJoinFinReq,(Response *)local_b8);
    local_e0._0_4_ = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&_Stack_150);
    uVar2 = local_e0._0_4_;
    if (_Stack_150._M_p != local_148 + 8) {
      operator_delete(_Stack_150._M_p);
    }
    if (uVar2 == kNone) {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"joiner-session","");
      local_158 = (undefined1  [8])0x70000000e;
      pcVar3 = "session(={}) sent JOIN_FIN.rsp: accepted={}";
      _Stack_150._M_p = "session(={}) sent JOIN_FIN.rsp: accepted={}";
      local_148._0_8_ = (CommissionerImpl *)0x2b;
      local_148._8_8_ = 0x200000000;
      local_130 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      local_128 = ::fmt::v10::detail::
                  parse_format_specs<bool,fmt::v10::detail::compile_parse_context<char>>;
      local_148._16_8_ = (JoinerSession *)local_158;
      local_118._M_allocated_capacity = (size_type)(JoinerSession *)local_158;
      do {
        cVar1 = *pcVar3;
        pcVar4 = pcVar3;
        while (cVar1 != '{') {
          pcVar4 = pcVar4 + 1;
          if (pcVar4 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_bool>_>
            ::writer::operator()((writer *)&local_118._M_allocated_capacity,pcVar3,"");
            goto LAB_001be5ff;
          }
          cVar1 = *pcVar4;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_bool>_>
        ::writer::operator()((writer *)&local_118._M_allocated_capacity,pcVar3,pcVar4);
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,bool>&>
                           (pcVar4,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      } while (pcVar3 != "");
LAB_001be5ff:
      local_158 = (undefined1  [8])local_120;
      fmt.size_ = 0x7e;
      fmt.data_ = (char *)0x2b;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_158;
      local_148._0_8_ = (CommissionerImpl *)(ulong)aAccept;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_100,(v10 *)"session(={}) sent JOIN_FIN.rsp: accepted={}",fmt,args);
      Log(kInfo,&local_178,(string *)local_100);
      if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
    }
  }
  if (local_e0._0_4_ != kNone) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"joiner-session","");
    local_158._0_4_ = 0xd;
    pcVar3 = "session(={}) sent JOIN_FIN.rsp failed: %s";
    _Stack_150._M_p = "session(={}) sent JOIN_FIN.rsp failed: %s";
    local_148._0_8_ = (CommissionerImpl *)0x29;
    local_148._8_8_ = 0x100000000;
    local_130 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_148._16_8_ = (JoinerSession *)local_158;
    local_118._M_allocated_capacity = (size_type)(JoinerSession *)local_158;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&local_118._M_allocated_capacity,pcVar3,"");
          goto LAB_001be733;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)&local_118._M_allocated_capacity,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar4,"",(format_string_checker<char> *)local_158);
    } while (pcVar3 != "");
LAB_001be733:
    Error::ToString_abi_cxx11_((string *)local_158,(Error *)local_e0);
    local_118._M_allocated_capacity = (size_type)local_158;
    local_118._8_8_ = _Stack_150._M_p;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x29;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_118;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_100,(v10 *)"session(={}) sent JOIN_FIN.rsp failed: %s",fmt_00,args_00
              );
    Log(kWarn,&local_178,(string *)local_100);
    if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  if ((event **)local_b8._88_8_ != local_50) {
    operator_delete((void *)local_b8._88_8_);
  }
  if ((event *)local_b8._64_8_ != (event *)0x0) {
    operator_delete((void *)local_b8._64_8_);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree((_Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
               *)(local_b8 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p);
  }
  return;
}

Assistant:

void JoinerSession::SendJoinFinResponse(const coap::Request &aJoinFinReq, bool aAccept)
{
    Error          error;
    coap::Response joinFin{coap::Type::kAcknowledgment, coap::Code::kChanged};
    SuccessOrExit(error = AppendTlv(joinFin, {tlv::Type::kState, aAccept ? tlv::kStateAccept : tlv::kStateReject}));

    joinFin.SetSubType(MessageSubType::kJoinFinResponse);
    SuccessOrExit(error = mCoap.SendResponse(aJoinFinReq, joinFin));

    LOG_INFO(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp: accepted={}", static_cast<void *>(this),
             aAccept);

#if OT_COMM_CONFIG_REFERENCE_DEVICE_ENABLE
    LOG_INFO(LOG_REGION_THCI, "session(={}) sent JOIN_FIN.rsp: {}", static_cast<void *>(this),
             utils::Hex(joinFin.GetPayload()));
#endif

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_JOINER_SESSION, "session(={}) sent JOIN_FIN.rsp failed: %s", error.ToString());
    }
}